

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImTextCountCharsFromUtf8(char *in_text,char *in_text_end)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  uint c;
  undefined8 uStack_28;
  
  iVar1 = 0;
  uStack_28 = in_RAX;
  do {
    iVar2 = iVar1;
    if ((in_text_end != (char *)0x0) && (in_text_end <= in_text)) {
      return iVar2;
    }
    if (*in_text == '\0') {
      return iVar2;
    }
    uVar3 = ImTextCharFromUtf8((uint *)((long)&uStack_28 + 4),in_text,in_text_end);
    in_text = in_text + uVar3;
    iVar1 = iVar2 + (uint)(uStack_28._4_4_ < 0x10000);
  } while (uStack_28._4_4_ != 0);
  return iVar2;
}

Assistant:

int ImTextCountCharsFromUtf8(const char* in_text, const char* in_text_end)
{
    int char_count = 0;
    while ((!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        if (c <= IM_UNICODE_CODEPOINT_MAX)
            char_count++;
    }
    return char_count;
}